

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void testing::internal::UniversalTersePrinter<const_wchar_t_*>::Print(wchar_t *str,ostream *os)

{
  long in_FS_OFFSET;
  allocator local_41;
  ostream *local_40;
  ostream *os_local;
  wchar_t *str_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = os;
  os_local = (ostream *)str;
  if (str == (wchar_t *)0x0) {
    std::operator<<(os,"NULL");
  }
  else {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring((wstring *)&str_local,str,&local_41);
    UniversalPrint<std::__cxx11::wstring>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               &str_local,local_40);
    std::__cxx11::wstring::~wstring((wstring *)&str_local);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_41);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Print(const wchar_t* str, ::std::ostream* os) {
                if (str == NULL) {
                    *os << "NULL";
                }
                else {
                    UniversalPrint(::std::wstring(str), os);
                }
            }